

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearAction::~IfcStructuralLinearAction
          (IfcStructuralLinearAction *this)

{
  ~IfcStructuralLinearAction
            ((IfcStructuralLinearAction *)
             (&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
               super_IfcObject.field_0x0 +
             *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                                 super_IfcProduct.super_IfcObject + -0x18)));
  return;
}

Assistant:

IfcStructuralLinearAction() : Object("IfcStructuralLinearAction") {}